

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O3

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::ModAsyncify<true,_false,_true>::create(ModAsyncify<true,_false,_true> *this)

{
  _func_int **__s;
  
  __s = (_func_int **)operator_new(0x150);
  memset(__s,0,0x150);
  __s[2] = (_func_int *)(__s + 4);
  __s[0xb] = (_func_int *)0x0;
  __s[0xc] = (_func_int *)0x0;
  __s[0x21] = (_func_int *)0x0;
  __s[0x22] = (_func_int *)0x0;
  __s[0x23] = (_func_int *)0x0;
  __s[0x24] = (_func_int *)0x0;
  *(undefined8 *)((long)__s + 0x121) = 0;
  *(undefined8 *)((long)__s + 0x129) = 0;
  *__s = (_func_int *)&PTR__WalkerPass_010719f0;
  __s[0x27] = (_func_int *)0x0;
  __s[0x28] = (_func_int *)0x0;
  *(undefined1 *)(__s + 0x29) = 0;
  (this->
  super_WalkerPass<wasm::LinearExecutionWalker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>_>
  ).super_Pass._vptr_Pass = __s;
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<
      ModAsyncify<neverRewind, neverUnwind, importsAlwaysUnwind>>();
  }